

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

PHYSFS_ErrorCode PHYSFS_getLastErrorCode(void)

{
  ErrState *pEVar1;
  PHYSFS_ErrorCode PVar2;
  
  pEVar1 = findErrorForCurrentThread();
  if (pEVar1 == (ErrState *)0x0) {
    PVar2 = PHYSFS_ERR_OK;
  }
  else {
    PVar2 = pEVar1->code;
    pEVar1->code = PHYSFS_ERR_OK;
  }
  return PVar2;
}

Assistant:

PHYSFS_ErrorCode PHYSFS_getLastErrorCode(void)
{
    ErrState *err = findErrorForCurrentThread();
    const PHYSFS_ErrorCode retval = (err) ? err->code : PHYSFS_ERR_OK;
    if (err)
        err->code = PHYSFS_ERR_OK;
    return retval;
}